

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true,_true>
                  *this,Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                        *xpr,Index i)

{
  long lVar1;
  
  MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_true>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_0>
            ,(xpr->
             super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             ).m_data + (xpr->m_stride).super_Stride<_1,_0>.m_outer.m_value * i,1,
            (xpr->
            super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            ).m_cols.m_value);
  (this->m_xpr).
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value =
       (xpr->
       super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       ).m_cols.m_value;
  lVar1 = (xpr->
          super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          ).m_rows.m_value;
  (this->m_xpr).
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (xpr->
            super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            ).m_data;
  (this->m_xpr).
  super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_rows.m_value = lVar1;
  lVar1 = (xpr->m_stride).super_Stride<_1,_0>.m_outer.m_value;
  (this->m_xpr).m_stride.super_Stride<_1,_0>.m_outer.m_value = lVar1;
  (this->m_startRow).m_value = i;
  (this->m_startCol).m_value = 0;
  this->m_outerStride = lVar1;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }